

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O1

void search_in_and_exp_files(string *path,list<int,_std::allocator<int>_> *files_to_run)

{
  size_t *psVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  uint uVar5;
  list<int,_std::allocator<int>_> *plVar6;
  undefined1 *puVar7;
  undefined1 auVar8 [8];
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  DIR *__dirp;
  dirent *pdVar12;
  size_t sVar13;
  _List_node_base *p_Var14;
  long *plVar15;
  undefined8 *puVar16;
  string *psVar17;
  ulong uVar18;
  long *plVar19;
  undefined8 uVar20;
  _Alloc_hider _Var21;
  undefined1 auVar22 [8];
  char *pcVar23;
  uint uVar24;
  undefined8 uStack_100;
  long *local_f8;
  list<int,_std::allocator<int>_> *local_f0;
  undefined1 *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string file_name;
  list<int,_std::allocator<int>_> in_files;
  long local_58;
  long lStack_50;
  undefined1 local_48 [8];
  list<int,_std::allocator<int>_> exp_files;
  
  local_e8 = (undefined1 *)&local_f8;
  file_name.field_2._8_8_ = (long)&file_name.field_2 + 8;
  in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev
       = (_List_node_base *)0x0;
  local_48 = (undefined1  [8])local_48;
  exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  lVar4 = -((ulong)((int)path->_M_string_length + 1) + 0xf & 0xfffffffffffffff0);
  pcVar23 = (path->_M_dataplus)._M_p;
  local_f0 = files_to_run;
  in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
       = (_List_node_base *)file_name.field_2._8_8_;
  exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)local_48;
  *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108c0e;
  strcpy((char *)((long)&local_f8 + lVar4),pcVar23);
  *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108c16;
  __dirp = opendir((char *)((long)&local_f8 + lVar4));
  if (__dirp != (DIR *)0x0) {
    psVar1 = &in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    while( true ) {
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108c35;
      pdVar12 = readdir(__dirp);
      if (pdVar12 == (dirent *)0x0) break;
      local_a0 = (undefined1  [8])&file_name._M_string_length;
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108c5b;
      sVar13 = strlen(pdVar12->d_name);
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108c6e;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,pdVar12->d_name,pdVar12->d_name + sVar13);
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108c82;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)psVar1,"^in([0-9]+)\\.txt$"
                 ,0x10);
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108c91;
      add_file_if_regex_ok
                ((regex *)psVar1,(list<int,_std::allocator<int>_> *)((long)&file_name.field_2 + 8),
                 (string *)local_a0);
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108c99;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)psVar1);
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108cad;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)psVar1,
                 "^exp([0-9]+)\\.txt$",0x10);
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108cbc;
      add_file_if_regex_ok
                ((regex *)psVar1,(list<int,_std::allocator<int>_> *)local_48,(string *)local_a0);
      *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108cc4;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)psVar1);
      auVar22 = local_a0;
      if (local_a0 != (undefined1  [8])&file_name._M_string_length) {
        *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108ce0;
        operator_delete((void *)auVar22);
      }
    }
    *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108ced;
    closedir(__dirp);
    *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108cf6;
    std::__cxx11::list<int,_std::allocator<int>_>::sort
              ((list<int,_std::allocator<int>_> *)((long)&file_name.field_2 + 8));
    *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108cff;
    std::__cxx11::list<int,_std::allocator<int>_>::sort((list<int,_std::allocator<int>_> *)local_48)
    ;
    if ((undefined1 *)file_name.field_2._8_8_ != (undefined1 *)((long)&file_name.field_2 + 8)) {
      uVar20 = file_name.field_2._8_8_;
      do {
        uVar2 = *(uint *)(uVar20 + 0x10);
        uVar5 = -uVar2;
        if (0 < (int)uVar2) {
          uVar5 = uVar2;
        }
        uVar24 = 1;
        if (9 < uVar5) {
          uVar18 = (ulong)uVar5;
          uVar10 = 4;
          do {
            uVar24 = uVar10;
            uVar11 = (uint)uVar18;
            if (uVar11 < 100) {
              uVar24 = uVar24 - 2;
              goto LAB_00108d75;
            }
            if (uVar11 < 1000) {
              uVar24 = uVar24 - 1;
              goto LAB_00108d75;
            }
            if (uVar11 < 10000) goto LAB_00108d75;
            uVar18 = uVar18 / 10000;
            uVar10 = uVar24 + 4;
          } while (99999 < uVar11);
          uVar24 = uVar24 + 1;
        }
LAB_00108d75:
        local_a0 = (undefined1  [8])&file_name._M_string_length;
        local_f8 = (long *)uVar20;
        *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108da9;
        std::__cxx11::string::_M_construct
                  ((ulong)local_a0,(char)uVar24 - (char)((int)uVar2 >> 0x1f));
        pcVar23 = (char *)((long)local_a0 + (ulong)(uVar2 >> 0x1f));
        *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108dbd;
        std::__detail::__to_chars_10_impl<unsigned_int>(pcVar23,uVar24,uVar5);
        if (*(uint *)&((_List_node_base *)((long)local_48 + 0x10))->_M_next == uVar2) {
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108dd3;
          p_Var14 = (_List_node_base *)operator_new(0x18);
          plVar6 = local_f0;
          *(uint *)&p_Var14[1]._M_next = uVar2;
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108dec;
          std::__detail::_List_node_base::_M_hook(p_Var14);
          _Var21._M_p = (pointer)local_48;
          psVar1 = &(plVar6->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
          super__List_node_base._M_prev =
               (_List_node_base *)
               ((long)&exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                       super__List_node_base._M_prev[-1]._M_prev + 7);
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108e00;
          std::__detail::_List_node_base::_M_unhook();
LAB_00108ffc:
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x109001;
          operator_delete(_Var21._M_p);
        }
        else if ((local_48 == (undefined1  [8])local_48) ||
                ((int)uVar2 < (int)*(uint *)&((_List_node_base *)((long)local_48 + 0x10))->_M_next))
        {
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108f47;
          std::operator+(&local_e0,".txt is present, but exp",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0);
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108f5a;
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
          plVar15 = puVar16 + 2;
          if ((long *)*puVar16 == plVar15) {
            local_58 = *plVar15;
            lStack_50 = puVar16[3];
            in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                 (size_t)&local_58;
          }
          else {
            local_58 = *plVar15;
            in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                 (size_t)*puVar16;
          }
          *puVar16 = plVar15;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108fb4;
          std::operator+(&local_c0,"in",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0);
          sVar9 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108fc4;
          psVar17 = (string *)std::__cxx11::string::_M_append((char *)&local_c0,sVar9);
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108fd1;
          write_colored_text(psVar17,red);
          _Var21._M_p = local_c0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108fe2;
            operator_delete(_Var21._M_p);
          }
          sVar9 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
          if ((long *)in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
              != &local_58) {
            *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108ff0;
            operator_delete((void *)sVar9);
          }
          _Var21._M_p = local_e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_00108ffc;
        }
        else {
          while (*(int *)&((_List_node_base *)((long)local_48 + 0x10))->_M_next < (int)uVar2) {
            *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108e57;
            std::operator+(&local_e0,".txt is present, but in",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0);
            *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108e66;
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_e0);
            plVar19 = plVar15 + 2;
            if ((long *)*plVar15 == plVar19) {
              local_58 = *plVar19;
              lStack_50 = plVar15[3];
              in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                   (size_t)&local_58;
            }
            else {
              local_58 = *plVar19;
              in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
                   (size_t)*plVar15;
            }
            *plVar15 = (long)plVar19;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108ec0;
            std::operator+(&local_c0,"exp",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0);
            sVar9 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
            *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108ed0;
            psVar17 = (string *)std::__cxx11::string::_M_append((char *)&local_c0,sVar9);
            *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108edd;
            write_colored_text(psVar17,red);
            _Var21._M_p = local_c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108eee;
              operator_delete(_Var21._M_p);
            }
            sVar9 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
            if ((long *)in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
                != &local_58) {
              *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108efc;
              operator_delete((void *)sVar9);
            }
            _Var21._M_p = local_e0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108f0d;
              operator_delete(_Var21._M_p);
            }
            auVar22 = local_48;
            exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
            super__List_node_base._M_prev =
                 (_List_node_base *)
                 ((long)&exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                         super__List_node_base._M_prev[-1]._M_prev + 7);
            *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108f1d;
            std::__detail::_List_node_base::_M_unhook();
            *(undefined8 *)((long)&uStack_100 + lVar4) = 0x108f25;
            operator_delete((void *)auVar22);
          }
        }
        auVar22 = local_a0;
        if (local_a0 != (undefined1  [8])&file_name._M_string_length) {
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x109019;
          operator_delete((void *)auVar22);
        }
        uVar20 = *local_f8;
      } while ((undefined1 *)uVar20 != (undefined1 *)((long)&file_name.field_2 + 8));
    }
    if (local_48 != (undefined1  [8])local_48) {
      auVar22 = local_48;
      do {
        uVar2 = *(uint *)&((_List_node_base *)((long)auVar22 + 0x10))->_M_next;
        uVar5 = -uVar2;
        if (0 < (int)uVar2) {
          uVar5 = uVar2;
        }
        uVar24 = 1;
        if (9 < uVar5) {
          uVar18 = (ulong)uVar5;
          uVar10 = 4;
          do {
            uVar24 = uVar10;
            uVar11 = (uint)uVar18;
            if (uVar11 < 100) {
              uVar24 = uVar24 - 2;
              goto LAB_001090b2;
            }
            if (uVar11 < 1000) {
              uVar24 = uVar24 - 1;
              goto LAB_001090b2;
            }
            if (uVar11 < 10000) goto LAB_001090b2;
            uVar18 = uVar18 / 10000;
            uVar10 = uVar24 + 4;
          } while (99999 < uVar11);
          uVar24 = uVar24 + 1;
        }
LAB_001090b2:
        local_a0 = (undefined1  [8])&file_name._M_string_length;
        *(undefined8 *)((long)&uStack_100 + lVar4) = 0x1090d4;
        std::__cxx11::string::_M_construct
                  ((ulong)local_a0,(char)uVar24 - (char)((int)uVar2 >> 0x1f));
        pcVar23 = (char *)((long)local_a0 + (ulong)(uVar2 >> 0x1f));
        *(undefined8 *)((long)&uStack_100 + lVar4) = 0x1090e9;
        std::__detail::__to_chars_10_impl<unsigned_int>(pcVar23,uVar24,uVar5);
        *(undefined8 *)((long)&uStack_100 + lVar4) = 0x109102;
        std::operator+(&local_e0,".txt is present, but in",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
        *(undefined8 *)((long)&uStack_100 + lVar4) = 0x109114;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_58 = *plVar15;
          lStack_50 = puVar16[3];
          in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
               (size_t)&local_58;
        }
        else {
          local_58 = *plVar15;
          in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
               (size_t)*puVar16;
        }
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        *(undefined8 *)((long)&uStack_100 + lVar4) = 0x10916e;
        std::operator+(&local_c0,"exp",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
        sVar9 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
        *(undefined8 *)((long)&uStack_100 + lVar4) = 0x10917e;
        psVar17 = (string *)std::__cxx11::string::_M_append((char *)&local_c0,sVar9);
        *(undefined8 *)((long)&uStack_100 + lVar4) = 0x10918b;
        write_colored_text(psVar17,red);
        _Var21._M_p = local_c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x1091a3;
          operator_delete(_Var21._M_p);
        }
        sVar9 = in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
        if ((long *)in_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size !=
            &local_58) {
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x1091b1;
          operator_delete((void *)sVar9);
        }
        _Var21._M_p = local_e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x1091c9;
          operator_delete(_Var21._M_p);
        }
        auVar8 = local_a0;
        if (local_a0 != (undefined1  [8])&file_name._M_string_length) {
          *(undefined8 *)((long)&uStack_100 + lVar4) = 0x1091e1;
          operator_delete((void *)auVar8);
        }
        auVar22 = (undefined1  [8])((_List_node_base *)auVar22)->_M_next;
      } while (auVar22 != (undefined1  [8])local_48);
    }
  }
  puVar7 = local_e8;
  auVar22 = local_48;
  while (auVar22 != (undefined1  [8])local_48) {
    p_Var14 = ((_List_node_base *)auVar22)->_M_next;
    *(undefined8 *)(puVar7 + -8) = 0x109213;
    operator_delete((void *)auVar22);
    auVar22 = (undefined1  [8])p_Var14;
  }
  puVar16 = (undefined8 *)file_name.field_2._8_8_;
  while (puVar16 != (undefined8 *)((long)&file_name.field_2 + 8)) {
    puVar3 = (undefined8 *)*puVar16;
    *(undefined8 *)(puVar7 + -8) = 0x109230;
    operator_delete(puVar16);
    puVar16 = puVar3;
  }
  return;
}

Assistant:

void search_in_and_exp_files(const string &path, list<int> &files_to_run) {
    struct dirent *entry;

    list<int> in_files;
    list<int> exp_files;

    // Convert string to char-array
    int length = path.size();
    char char_path[length + 1];
    strcpy(char_path, path.c_str());

    // Open the directory
    DIR *dir = opendir(char_path);
    if (dir == nullptr) return;

    // Read each filename from the directory
    while ((entry = readdir(dir)) != nullptr) {
        string file_name = entry->d_name;

        /*
         * I just want to search for in1.txt, in2.txt, ..., in15.txt, in16.txt, ...
         * And I just want to extract the number 1, 2, ..., 15, 16, ..
         * See https://regex101.com for nice interactive explaining of the regex.
         * - ^      -> must start with what follows
         * - ^in    -> must start with 'in'
         * - (...)  -> first capture group -> get with $1
         * - [0-9]+ -> at least one digit
         * - \\.    -> a dot has to be present (note: in many languages, just one \ is required, also on https://regex101.com/)
         * - txt$   -> must end with txt
         */
        add_file_if_regex_ok(regex("^in([0-9]+)\\.txt$"), in_files, file_name);
        add_file_if_regex_ok(regex("^exp([0-9]+)\\.txt$"), exp_files, file_name);
    }
    closedir(dir);

    // Sort the file-lists
    in_files.sort();
    exp_files.sort();

    // Only add files to 'files_to_run', if the inXX.txt AND the expXX.txt are present:
    for (int in : in_files) {
        string i = to_string(in);
        if (exp_files.front() == in) {
            files_to_run.push_back(in);
            exp_files.pop_front();
        } else if (exp_files.empty() || exp_files.front() > in) {
            write_colored_text("in" + i += ".txt is present, but exp" + i + ".txt missing -> Skipping test!\n");
        } else {
            while (exp_files.front() < in) {
                write_colored_text("exp" + i += ".txt is present, but in" + i + ".txt missing -> Skipping test!\n");
                exp_files.pop_front();
            }
        }
    }
    // Possibly remaining exp-files (without in-files):
    for (int exp: exp_files) {
        string i = to_string(exp);
        write_colored_text("exp" + i += ".txt is present, but in" + i + ".txt missing -> Skipping test!\n");
    }
}